

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::Integrator
          (FormattingScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  undefined1 uVar1;
  bool bVar2;
  ostream *poVar3;
  string *in_RDX;
  ParameterDictionary *in_RDI;
  string lss;
  vector<int,_std::allocator<int>_> iterations;
  string extra;
  ParameterDictionary dict;
  string *in_stack_fffffffffffffc18;
  ParameterDictionary *in_stack_fffffffffffffc20;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffc30;
  RGBColorSpace *in_stack_fffffffffffffc40;
  int extra_00;
  FormattingScene *in_stack_fffffffffffffc48;
  ParameterDictionary *in_stack_fffffffffffffc50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  undefined7 in_stack_fffffffffffffc68;
  string local_378 [12];
  int in_stack_fffffffffffffc94;
  ParameterDictionary *in_stack_fffffffffffffc98;
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [39];
  undefined1 local_269 [40];
  undefined1 local_241 [33];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [39];
  undefined1 local_199 [40];
  undefined1 local_171 [33];
  vector<int,_std::allocator<int>_> local_150;
  undefined1 local_131 [33];
  string local_110 [272];
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_stack_fffffffffffffc30,
                  (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28));
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffc50,(ParsedParameterVector *)in_stack_fffffffffffffc48,
             in_stack_fffffffffffffc40);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&in_stack_fffffffffffffc20->params);
  std::__cxx11::string::string(local_110);
  if ((undefined1  [64])((undefined1  [64])(in_RDI->params).field_2 & (undefined1  [64])0x100) !=
      (undefined1  [64])0x0) {
    uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18);
    if ((bool)uVar1) {
      in_stack_fffffffffffffc60 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_131;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                 (allocator<char> *)in_stack_fffffffffffffc50);
      ParameterDictionary::RemoveInt(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string((string *)(local_131 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_131);
      in_stack_fffffffffffffc58 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_171;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                 (allocator<char> *)in_stack_fffffffffffffc50);
      ParameterDictionary::GetIntArray
                ((ParameterDictionary *)
                 CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                 (string *)in_stack_fffffffffffffc20);
      std::__cxx11::string::~string((string *)(local_171 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_171);
      bVar2 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc30);
      if (!bVar2) {
        in_stack_fffffffffffffc50 = (ParameterDictionary *)local_199;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                   (allocator<char> *)in_stack_fffffffffffffc50);
        ParameterDictionary::RemoveInt(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        std::__cxx11::string::~string((string *)(local_199 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_199);
        indent_abi_cxx11_(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20))
        ;
        std::vector<int,_std::allocator<int>_>::operator[](&local_150,0);
        StringPrintf<int&>((char *)in_stack_fffffffffffffc48,(int *)in_stack_fffffffffffffc40);
        std::operator+(in_stack_fffffffffffffc58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc50);
        std::__cxx11::string::operator+=(local_110,local_1c0);
        std::__cxx11::string::~string(local_1c0);
        std::__cxx11::string::~string(local_200);
        std::__cxx11::string::~string(local_1e0);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc30);
    }
    in_stack_fffffffffffffc48 = (FormattingScene *)local_241;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
               (allocator<char> *)in_stack_fffffffffffffc50);
    in_stack_fffffffffffffc40 = (RGBColorSpace *)local_269;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
               (allocator<char> *)in_stack_fffffffffffffc50);
    ParameterDictionary::GetOneString
              (in_RDI,in_RDX,(string *)CONCAT17(uVar1,in_stack_fffffffffffffc68));
    std::__cxx11::string::~string((string *)(local_269 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_269);
    std::__cxx11::string::~string((string *)(local_241 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_241);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                 (allocator<char> *)in_stack_fffffffffffffc50);
      ParameterDictionary::RemoveString(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      std::__cxx11::string::~string(local_290);
      std::allocator<char>::~allocator(&local_291);
      indent_abi_cxx11_(in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                     (char *)in_stack_fffffffffffffc20);
      std::__cxx11::string::operator+=(local_110,local_2b8);
      std::__cxx11::string::~string(local_2b8);
      std::__cxx11::string::~string(local_2d8);
    }
    std::__cxx11::string::~string(local_220);
  }
  extra_00 = (int)((ulong)in_stack_fffffffffffffc40 >> 0x20);
  if (((undefined1  [64])((undefined1  [64])(in_RDI->params).field_2 & (undefined1  [64])0x100) ==
       (undefined1  [64])0x0) ||
     (uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18),
     !(bool)uVar1)) {
    indent_abi_cxx11_(in_stack_fffffffffffffc48,extra_00);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc50);
    std::__cxx11::string::~string(local_358);
  }
  else {
    indent_abi_cxx11_(in_stack_fffffffffffffc48,extra_00);
    Printf<std::__cxx11::string>
              ((char *)in_stack_fffffffffffffc50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc48);
    std::__cxx11::string::~string(local_2f8);
    indent_abi_cxx11_(in_stack_fffffffffffffc48,extra_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,in_stack_fffffffffffffc28),(char *)in_stack_fffffffffffffc20);
    std::__cxx11::string::operator+=(local_110,local_318);
    std::__cxx11::string::~string(local_318);
    std::__cxx11::string::~string(local_338);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,local_110);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (in_stack_fffffffffffffc98,in_stack_fffffffffffffc94);
  std::operator<<(poVar3,local_378);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_110);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x680fc5);
  return;
}

Assistant:

void FormattingScene::Integrator(const std::string &name, ParsedParameterVector params,
                                 FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    std::string extra;
    if (upgrade) {
        if (name == "sppm") {
            dict.RemoveInt("imagewritefrequency");

            std::vector<int> iterations = dict.GetIntArray("numiterations");
            if (!iterations.empty()) {
                dict.RemoveInt("numiterations");
                extra += indent(1) +
                         StringPrintf("\"integer iterations\" [ %d ]\n", iterations[0]);
            }
        }
        std::string lss = dict.GetOneString("lightsamplestrategy", "");
        if (lss == "spatial") {
            dict.RemoveString("lightsamplestrategy");
            extra += indent(1) + "\"string lightsamplestrategy\" \"bvh\"\n";
        }
    }

    if (upgrade && name == "directlighting") {
        Printf("%sIntegrator \"path\"\n", indent());
        extra += indent(1) + "\"integer maxdepth\" [ 1 ]\n";
    } else
        Printf("%sIntegrator \"%s\"\n", indent(), name);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}